

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_spectrum.cpp
# Opt level: O0

Spectrum *
window_standards::create_spectrum
          (Spectrum *__return_storage_ptr__,string *line,string *standard_directory)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  double dVar4;
  Spectrum local_190;
  undefined1 local_138 [8];
  string spectum_path;
  string b;
  string a;
  smatch matches_1;
  regex pattern_1;
  string val;
  smatch matches;
  regex pattern;
  string *standard_directory_local;
  string *line_local;
  Spectrum *spectrum;
  
  Spectrum::Spectrum(__return_storage_ptr__);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"None",0);
  if (sVar2 == 0xffffffffffffffff) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (line,"Blackbody",0);
    if ((sVar2 == 0xffffffffffffffff) ||
       (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(line,".SSP",0), sVar2 != 0xffffffffffffffff)) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (line,"UV Action",0);
      if ((sVar2 == 0xffffffffffffffff) ||
         (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(line,".SSP",0), sVar2 != 0xffffffffffffffff)) {
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(line,"Krochmann",0);
        if ((sVar2 == 0xffffffffffffffff) ||
           (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find(line,".SSP",0), sVar2 != 0xffffffffffffffff)) {
          std::__cxx11::string::string((string *)local_138,standard_directory);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     line);
          load_spectrum(&local_190,(string *)local_138);
          Spectrum::operator=(__return_storage_ptr__,&local_190);
          Spectrum::~Spectrum(&local_190);
          std::__cxx11::string::~string((string *)local_138);
        }
        else {
          __return_storage_ptr__->type = KROCHMANN;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&__return_storage_ptr__->description,"Krochmann");
        }
      }
      else {
        __return_storage_ptr__->type = UV_ACTION;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&__return_storage_ptr__->description,"UV Action");
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&matches_1._M_begin,
                   ".*a=(.*), b=(.*)\\)",0x10);
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&a.field_2 + 8));
        bVar1 = std::
                regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)((long)&a.field_2 + 8),
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                           &matches_1._M_begin,0);
        if (bVar1) {
          pvVar3 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)((long)&a.field_2 + 8),1);
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str((string_type *)((long)&b.field_2 + 8),pvVar3);
          pvVar3 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)((long)&a.field_2 + 8),2);
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str((string_type *)((long)&spectum_path.field_2 + 8),pvVar3);
          dVar4 = std::__cxx11::stod((string *)((long)&b.field_2 + 8),(size_t *)0x0);
          __return_storage_ptr__->a = dVar4;
          dVar4 = std::__cxx11::stod((string *)((long)&spectum_path.field_2 + 8),(size_t *)0x0);
          __return_storage_ptr__->b = dVar4;
          std::__cxx11::string::~string((string *)(spectum_path.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(b.field_2._M_local_buf + 8));
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)((long)&a.field_2 + 8));
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&matches_1._M_begin);
      }
    }
    else {
      __return_storage_ptr__->type = BLACKBODY;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&__return_storage_ptr__->description,"Blackbody");
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&matches._M_begin,
                 ".*T=(.*)K\\)",0x10);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)((long)&val.field_2 + 8));
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)((long)&val.field_2 + 8),
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&matches._M_begin,0
                        );
      if (bVar1) {
        pvVar3 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)((long)&val.field_2 + 8),1);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)
              &pattern_1._M_automaton.
               super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount,pvVar3);
        dVar4 = std::__cxx11::stod((string *)
                                   &pattern_1._M_automaton.
                                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,(size_t *)0x0);
        __return_storage_ptr__->t = dVar4;
        std::__cxx11::string::~string
                  ((string *)
                   &pattern_1._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)((long)&val.field_2 + 8));
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&matches._M_begin);
    }
  }
  else {
    __return_storage_ptr__->type = NONE;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&__return_storage_ptr__->description,"None");
  }
  return __return_storage_ptr__;
}

Assistant:

Spectrum create_spectrum(std::string const & line, std::string const & standard_directory)
    {
        Spectrum spectrum;

        if(line.find("None") != std::string::npos)
        {
            spectrum.type = Spectrum_Type::NONE;
            spectrum.description = "None";
        }
        else if(line.find("Blackbody") != std::string::npos && line.find(".SSP") == std::string::npos)
        {
            spectrum.type = Spectrum_Type::BLACKBODY;
            spectrum.description = "Blackbody";

            std::regex pattern(".*T=(.*)K\\)");
            // auto itr = std::sregex_iterator(line.begin(), line.end(), pattern);
            // std::string val = itr->str();
            std::smatch matches;
            if(std::regex_search(line, matches, pattern))
            {
                std::string val = matches[1].str();
                spectrum.t = std::stod(val);
            }
        }
        else if(line.find("UV Action") != std::string::npos && line.find(".SSP") == std::string::npos)
        {
            spectrum.type = Spectrum_Type::UV_ACTION;
            spectrum.description = "UV Action";
            std::regex pattern(".*a=(.*), b=(.*)\\)");
            // auto itr = std::sregex_iterator(line.begin(), line.end(), pattern);
            // std::string a = itr->str(1);
            // std::string a = itr->str(2);
            std::smatch matches;
            if(std::regex_search(line, matches, pattern))
            {
                std::string a = matches[1].str();
                std::string b = matches[2].str();
                spectrum.a = std::stod(a);
                spectrum.b = std::stod(b);
            }
        }
        else if((line.find("Krochmann") != std::string::npos) && (line.find(".SSP") == std::string::npos))
        {
            spectrum.type = Spectrum_Type::KROCHMANN;
            spectrum.description = "Krochmann";
        }
        else
        {
            std::string spectum_path = standard_directory;
            spectum_path += line;
            spectrum = load_spectrum(spectum_path);
        }

        return spectrum;
    }